

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O2

void mpr_print_addr_set(avl_tree *set)

{
  undefined8 uVar1;
  avl_tree *paVar2;
  ulong uVar3;
  netaddr_str buf1;
  
  paVar2 = set;
  while (paVar2 = (avl_tree *)(paVar2->list_head).next,
        (paVar2->list_head).prev != (set->list_head).prev) {
    uVar3 = (ulong)LOG_MPR;
    if (((&log_global_mask)[uVar3] & 1) != 0) {
      uVar1 = netaddr_to_prefixstring(&buf1,&paVar2[-1].root,0);
      oonf_log(1,uVar3,"src/nhdp/mpr/neighbor-graph.c",0xe1,0,0,"%s",uVar1);
    }
  }
  return;
}

Assistant:

void
mpr_print_addr_set(struct avl_tree *set) {
  struct addr_node *current_node;
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str buf1;
#endif

  avl_for_each_element(set, current_node, _avl_node) {
    OONF_DEBUG(LOG_MPR, "%s", netaddr_to_string(&buf1, &current_node->addr));
  }
}